

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O1

gdouble media_player2_player_skeleton_get_maximum_rate(MediaPlayer2Player *object)

{
  GType GVar1;
  long lVar2;
  gdouble gVar3;
  
  GVar1 = media_player2_player_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
  gVar3 = (gdouble)g_value_get_double(**(long **)(lVar2 + 0x20) + 0xc0);
  g_mutex_unlock(*(long *)(lVar2 + 0x20) + 0x20);
  return gVar3;
}

Assistant:

static gdouble 
media_player2_player_skeleton_get_maximum_rate (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (object);
  gdouble value;
  g_mutex_lock (&skeleton->priv->lock);
  value = g_value_get_double (&(skeleton->priv->properties[8]));
  g_mutex_unlock (&skeleton->priv->lock);
  return value;
}